

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void addtobill(obj *obj,boolean ininv,boolean dummy,boolean silent)

{
  obj *poVar1;
  int iVar2;
  uint uVar3;
  monst *mtmp;
  bill_x *pbVar4;
  long lVar5;
  long amount;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  char buf [256];
  long local_150;
  char local_138 [7];
  undefined4 uStack_131;
  
  if (u.ushops[0] == '\0') {
    return;
  }
  poVar1 = obj->cobj;
  mtmp = shop_keeper(level,u.ushops[0]);
  if (mtmp == (monst *)0x0) {
    return;
  }
  iVar2 = inhishop(mtmp);
  if (iVar2 == 0) {
    return;
  }
  pbVar4 = onbill(obj,mtmp,'\0');
  if (pbVar4 != (bill_x *)0x0) {
    return;
  }
  if (obj->oclass == '\a') {
    if (obj->oeaten != 0) {
      return;
    }
    if (*(short *)((long)&mtmp[0x1b].misc_worn_check + 2) == 200) {
LAB_0022e22d:
      pline("You got that for free!");
      return;
    }
  }
  else {
    if (*(short *)((long)&mtmp[0x1b].misc_worn_check + 2) == 200) goto LAB_0022e22d;
    if (obj->oclass == '\f') {
      costly_gold(obj->ox,obj->oy,(long)obj->quan);
      return;
    }
  }
  uVar3 = *(uint *)&obj->field_0x4a;
  if ((uVar3 & 8) == 0) {
    local_150 = get_cost(obj,mtmp);
    uVar3 = *(uint *)&obj->field_0x4a;
  }
  else {
    local_150 = 0;
  }
  if ((uVar3 & 8) != 0 && poVar1 == (obj *)0x0) {
LAB_0022e3f2:
    *(uint *)&obj->field_0x4a = uVar3 & 0xfffffff7;
    return;
  }
  if (poVar1 == (obj *)0x0) {
    add_one_tobill(obj,dummy);
  }
  else if (obj->cobj == (obj *)0x0) {
    if ((uVar3 & 8) != 0) goto LAB_0022e3f2;
    add_one_tobill(obj,dummy);
  }
  else {
    lVar5 = contained_cost(obj,mtmp,0,'\0','\0');
    amount = contained_gold(obj);
    if (local_150 != 0) {
      add_one_tobill(obj,dummy);
    }
    if (lVar5 != 0) {
      bill_box_content(obj,dummy);
    }
    picked_container(obj);
    local_150 = local_150 + lVar5;
    if ((amount != 0) && (costly_gold(obj->ox,obj->oy,amount), local_150 == 0)) {
      return;
    }
    if ((*(uint *)&obj->field_0x4a & 8) != 0) {
      *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffff7;
    }
  }
  uVar3 = *(uint *)&mtmp->field_0x60;
  if ((((uVar3 >> 0x12 & 1) == 0) || (silent != '\0')) || ((uVar3 & 0x80000) != 0)) {
    if (silent != '\0') {
      return;
    }
    if (local_150 != 0) {
      pcVar6 = xname(obj);
      pcVar6 = the(pcVar6);
      pcVar7 = currency(local_150);
      pcVar9 = "";
      if (1 < obj->quan) {
        pcVar9 = " each";
      }
      pline("The list price of %s is %ld %s%s.",pcVar6,local_150,pcVar7,pcVar9);
      return;
    }
    pcVar6 = Monnam(mtmp);
    pline("%s does not notice.",pcVar6);
    return;
  }
  if (local_150 == 0) {
    pcVar6 = Monnam(mtmp);
    pcVar7 = xname(obj);
    pcVar7 = the(pcVar7);
    pline("%s has no interest in %s.",pcVar6,pcVar7);
    return;
  }
  builtin_strncpy(local_138,"\"For yo",7);
  uStack_131 = 0x202c75;
  if ((uVar3 >> 0x16 & 1) == 0) {
    sVar8 = strlen(local_138);
    builtin_strncpy(local_138 + sVar8,"scum",5);
  }
  else {
    uVar3 = mt_random();
    strcat(local_138,
           append_honorific_honored_rel +
           *(int *)(append_honorific_honored_rel +
                   ((uVar3 & 3) + (uint)(((uint)u.uevent >> 0xd & 1) != 0)) * 4));
    if (((youmonst.data)->mlet == '0') || (uVar3 = (youmonst.data)->mflags2, (uVar3 >> 8 & 1) != 0))
    {
      pcVar6 = " dark lady";
      if (flags.female == '\0') {
        pcVar6 = " dark lord";
      }
      sVar8 = strlen(local_138);
      *(undefined8 *)(local_138 + sVar8) = *(undefined8 *)pcVar6;
      *(undefined4 *)((long)&uStack_131 + sVar8) = *(undefined4 *)(pcVar6 + 7);
    }
    else {
      if ((uVar3 & 0x10) == 0) {
        if ((uVar3 & 8) == 0) {
          sVar8 = strlen(local_138);
          builtin_strncpy(local_138 + sVar8," creatur",8);
          *(undefined2 *)((long)&uStack_131 + sVar8 + 1) = 0x65;
          goto LAB_0022e55e;
        }
        pcVar7 = " sir";
        pcVar6 = " lady";
      }
      else {
        pcVar7 = " hir";
        pcVar6 = " hiril";
      }
      if (flags.female == '\0') {
        pcVar6 = pcVar7;
      }
      strcat(local_138,pcVar6);
    }
  }
LAB_0022e55e:
  if (ininv == '\0') {
    pcVar6 = xname(obj);
    pcVar6 = The(pcVar6);
    pcVar7 = currency(local_150);
    pcVar9 = "";
    if (1 < obj->quan) {
      pcVar9 = " each";
    }
    pline("%s will cost you %ld %s%s.",pcVar6,local_150,pcVar7,pcVar9);
  }
  else {
    iVar2 = obj->quan;
    obj->quan = 1;
    pcVar6 = "for this";
    if (1 < iVar2) {
      pcVar6 = "per";
    }
    pcVar7 = xname(obj);
    pline("%s; only %ld %s %s.\"",local_138,local_150,pcVar6,pcVar7);
    obj->quan = iVar2;
  }
  return;
}

Assistant:

void addtobill(struct obj *obj, boolean ininv, boolean dummy, boolean silent)
{
	struct monst *shkp;
	char roomno = *u.ushops;
	long ltmp = 0L, cltmp = 0L, gltmp = 0L;
	boolean container = Has_contents(obj);

	if (!*u.ushops) return;

	if (!(shkp = shop_keeper(level, roomno))) return;

	if (!inhishop(shkp)) return;

	if (/* perhaps we threw it away earlier */
		 onbill(obj, shkp, FALSE) ||
		 (obj->oclass == FOOD_CLASS && obj->oeaten)
	      ) return;

	if (ESHK(shkp)->billct == BILLSZ) {
		pline("You got that for free!");
		return;
	}

	if (obj->oclass == COIN_CLASS) {
		costly_gold(obj->ox, obj->oy, obj->quan);
		return;
	}

	if (!obj->no_charge)
	    ltmp = get_cost(obj, shkp);

	if (obj->no_charge && !container) {
		obj->no_charge = 0;
		return;
	}

	if (container) {
	    if (obj->cobj == NULL) {
		if (obj->no_charge) {
		    obj->no_charge = 0;
		    return;
		} else {
		    add_one_tobill(obj, dummy);
		    goto speak;
		}
	    } else {
		cltmp += contained_cost(obj, shkp, cltmp, FALSE, FALSE);
		gltmp += contained_gold(obj);
	    }

	    if (ltmp) add_one_tobill(obj, dummy);
	    if (cltmp) bill_box_content(obj, dummy);
	    picked_container(obj); /* reset contained obj->no_charge */

	    ltmp += cltmp;

	    if (gltmp) {
		costly_gold(obj->ox, obj->oy, gltmp);
		if (!ltmp) return;
	    }

	    if (obj->no_charge)
		obj->no_charge = 0;

	} else /* i.e., !container */
	    add_one_tobill(obj, dummy);
speak:
	if (shkp->mcanmove && !shkp->msleeping && !silent) {
	    char buf[BUFSZ];

	    if (!ltmp) {
		pline("%s has no interest in %s.", Monnam(shkp),
					     the(xname(obj)));
		return;
	    }
	    strcpy(buf, "\"For you, ");
	    if (ANGRY(shkp)) strcat(buf, "scum");
	    else append_honorific(buf);
	    if (ininv) {
		long quan = obj->quan;
		obj->quan = 1L; /* fool xname() into giving singular */
		pline("%s; only %ld %s %s.\"", buf, ltmp,
			(quan > 1L) ? "per" : "for this", xname(obj));
		obj->quan = quan;
	    } else
		pline("%s will cost you %ld %s%s.",
			The(xname(obj)), ltmp, currency(ltmp),
			(obj->quan > 1L) ? " each" : "");
	} else if (!silent) {
	    if (ltmp) pline("The list price of %s is %ld %s%s.",
				   the(xname(obj)), ltmp, currency(ltmp),
				   (obj->quan > 1L) ? " each" : "");
	    else pline("%s does not notice.", Monnam(shkp));
	}
}